

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  uv_sem_t *sem;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_28;
  
  memset(wc,0,0xa8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  iVar1 = uv_sem_init(&wc->sem_waiting,0);
  local_28 = SEXT48(iVar1);
  if (local_28 == 0) {
    iVar1 = uv_sem_init(&wc->sem_signaled,0);
    local_28 = SEXT48(iVar1);
    if (local_28 != 0) goto LAB_0017ffa5;
    iVar1 = uv_cond_init(&wc->cond);
    local_28 = SEXT48(iVar1);
    if (local_28 == 0) {
      iVar1 = uv_mutex_init(&wc->mutex);
      local_28 = SEXT48(iVar1);
      if (local_28 == 0) {
        return;
      }
      goto LAB_0017ffc3;
    }
  }
  else {
    worker_config_init_cold_1();
LAB_0017ffa5:
    worker_config_init_cold_2();
  }
  worker_config_init_cold_3();
LAB_0017ffc3:
  sem = (uv_sem_t *)&stack0xffffffffffffffd8;
  worker_config_init_cold_4();
  uv_mutex_destroy((uv_mutex_t *)(sem + 2));
  uv_cond_destroy((uv_cond_t *)((long)sem + 0x68));
  uv_sem_destroy(sem + 1);
  uv_sem_destroy(sem);
  return;
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT_OK(uv_sem_init(&wc->sem_waiting, 0));
  ASSERT_OK(uv_sem_init(&wc->sem_signaled, 0));
  ASSERT_OK(uv_cond_init(&wc->cond));
  ASSERT_OK(uv_mutex_init(&wc->mutex));
}